

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O2

bool __thiscall EmmyFacade::PipeConnect(EmmyFacade *this,lua_State *L,string *name,string *err)

{
  bool bVar1;
  shared_ptr<PipelineClientTransporter> p;
  
  Destroy(this);
  EmmyDebuggerManager::AddDebugger
            ((EmmyDebuggerManager *)&stack0xffffffffffffffc8,
             (lua_State *)&this->_emmyDebuggerManager);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
  (*lua_sethook)(L,ReadyLuaHook,7,0);
  std::make_shared<PipelineClientTransporter>();
  std::__shared_ptr<Transporter,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Transporter,(__gnu_cxx::_Lock_policy)2> *)&this->transporter,
             &p.super___shared_ptr<PipelineClientTransporter,_(__gnu_cxx::_Lock_policy)2>);
  bVar1 = PipelineClientTransporter::Connect
                    (p.super___shared_ptr<PipelineClientTransporter,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,name,err);
  if (bVar1) {
    WaitIDE(this,true,0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<PipelineClientTransporter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return bVar1;
}

Assistant:

bool EmmyFacade::PipeConnect(lua_State *L, const std::string &name, std::string &err) {
	Destroy();

	_emmyDebuggerManager.AddDebugger(L);

	SetReadyHook(L);

	const auto p = std::make_shared<PipelineClientTransporter>();
	transporter = p;
	// p->SetHandler(shared_from_this());
	const auto suc = p->Connect(name, err);
	if (suc) {
		WaitIDE(true);
	}
	return suc;
}